

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementAnimation.h
# Opt level: O0

void __thiscall
Rml::AnimationKey::AnimationKey(AnimationKey *this,float time,Property *property,Tween tween)

{
  Property *property_local;
  float time_local;
  AnimationKey *this_local;
  Tween tween_local;
  
  this->time = time;
  Property::Property(&this->property,property);
  (this->tween).type_in = (int)tween._0_8_;
  (this->tween).type_out = (int)((ulong)tween._0_8_ >> 0x20);
  (this->tween).callback = tween.callback;
  return;
}

Assistant:

AnimationKey(float time, const Property& property, Tween tween) : time(time), property(property), tween(tween) {}